

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

int Sim_UtilCountSuppSizes(Sim_Man_t *p,int fStruct)

{
  uint uVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  pAVar3 = p->pNtk;
  uVar1 = pAVar3->vCos->nSize;
  if (fStruct == 0) {
    if ((int)uVar1 < 1) {
      return 0;
    }
    uVar2 = pAVar3->vCis->nSize;
    uVar5 = 0;
    iVar4 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar6 = 0;
        do {
          iVar4 = iVar4 + (uint)((*(uint *)((long)p->vSuppFun->pArray[uVar5] +
                                           (ulong)(uVar6 >> 5) * 4) >> (uVar6 & 0x1f) & 1) != 0);
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  else {
    if ((int)uVar1 < 1) {
      return 0;
    }
    uVar2 = pAVar3->vCis->nSize;
    uVar5 = 0;
    iVar4 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar6 = 0;
        do {
          iVar4 = iVar4 + (uint)((*(uint *)((long)p->vSuppStr->pArray
                                                  [*(int *)((long)pAVar3->vCos->pArray[uVar5] + 0x10
                                                           )] + (ulong)(uVar6 >> 5) * 4) >>
                                  (uVar6 & 0x1f) & 1) != 0);
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  return iVar4;
}

Assistant:

int Sim_UtilCountSuppSizes( Sim_Man_t * p, int fStruct )
{
    Abc_Obj_t * pNode, * pNodeCi;
    int i, v, Counter;
    Counter = 0;
    if ( fStruct )
    {
        Abc_NtkForEachCo( p->pNtk, pNode, i )
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                Counter += Sim_SuppStrHasVar( p->vSuppStr, pNode, v );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pNode, i )
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                Counter += Sim_SuppFunHasVar( p->vSuppFun, i, v );
    }
    return Counter;
}